

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

ssize_t Bcj2_Decode(_7zip *zip,uint8_t *outBuf,size_t outSize)

{
  size_t *psVar1;
  long lVar2;
  byte bVar3;
  uchar uVar4;
  ushort uVar5;
  uint uVar6;
  uchar *puVar7;
  size_t sVar8;
  uchar *puVar9;
  size_t sVar10;
  uchar *puVar11;
  size_t sVar12;
  size_t sVar13;
  int iVar14;
  uint *puVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  size_t sVar19;
  uint16_t *puVar20;
  uint uVar21;
  uint uVar22;
  size_t sVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  uint8_t out [4];
  uint8_t local_84 [4];
  size_t local_80;
  byte *local_78;
  ulong local_70;
  uint *local_68;
  uint *local_60;
  ulong local_58;
  ulong local_50;
  byte *local_48;
  uchar *local_40;
  uint16_t *local_38;
  
  sVar23 = zip->tmp_stream_bytes_remaining;
  puVar7 = zip->tmp_stream_buff;
  sVar8 = zip->tmp_stream_bytes_avail;
  local_50 = zip->sub_stream_bytes_remaining[0];
  puVar9 = zip->sub_stream_buff[0];
  sVar10 = zip->sub_stream_size[0];
  puVar11 = zip->sub_stream_buff[1];
  local_58 = zip->sub_stream_bytes_remaining[1];
  sVar12 = zip->sub_stream_bytes_remaining[2];
  local_48 = zip->sub_stream_buff[2] + zip->sub_stream_size[2];
  local_78 = local_48 + -sVar12;
  sVar13 = zip->sub_stream_size[1];
  if (zip->bcj_state == 0) {
    zip->bcj2_prevByte = '\0';
    lVar18 = 0;
    do {
      zip->bcj2_p[lVar18] = 0x400;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x102);
    zip->bcj2_range = 0xffffffff;
    zip->bcj2_code = 0;
    sVar19 = 0;
    do {
      if (sVar12 == sVar19) {
        return -0x19;
      }
      zip->bcj2_code = (uint)local_78[sVar19] | zip->bcj2_code << 8;
      sVar19 = sVar19 + 1;
    } while ((int)sVar19 != 5);
    zip->bcj_state = 1;
    local_78 = local_78 + sVar19;
  }
  uVar24 = 0;
  if (outSize != 0 && zip->odd_bcj_size != 0) {
    do {
      outBuf[uVar24] = zip->odd_bcj[uVar24 & 0xffffffff];
      uVar24 = uVar24 + 1;
      psVar1 = &zip->odd_bcj_size;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) break;
    } while (uVar24 < outSize);
  }
  if (outSize != 0) {
    lVar18 = sVar8 - sVar23;
    local_60 = (uint *)(puVar9 + (sVar10 - local_50));
    local_68 = (uint *)(puVar11 + (sVar13 - local_58));
    local_38 = zip->bcj2_p;
    local_40 = zip->odd_bcj;
    lVar25 = 0;
    local_80 = sVar23;
    local_70 = outSize;
    do {
      uVar16 = outSize - uVar24;
      if (sVar23 - lVar25 <= outSize - uVar24) {
        uVar16 = sVar23 - lVar25;
      }
      if ((zip->bcj_state == 1) && (uVar17 = uVar24, uVar16 != 0)) {
        do {
          uVar24 = uVar17 + 1;
          bVar3 = puVar7[lVar25 + lVar18];
          outBuf[uVar17] = bVar3;
          if (((bVar3 & 0xfe) == 0xe8) ||
             (((bVar3 & 0xf0) == 0x80 && (zip->bcj2_prevByte == '\x0f')))) {
            zip->bcj_state = 2;
            bVar26 = false;
          }
          else {
            lVar25 = lVar25 + 1;
            zip->bcj2_prevByte = bVar3;
            uVar16 = uVar16 - 1;
            bVar26 = true;
          }
          if (!bVar26) goto LAB_0012e978;
          uVar17 = uVar24;
        } while (uVar16 != 0);
        uVar16 = 0;
      }
LAB_0012e978:
      iVar14 = 0xd;
      if ((uVar24 != outSize) && (uVar16 != 0)) {
        zip->bcj_state = 1;
        uVar4 = puVar7[lVar25 + lVar18];
        if (uVar4 == 0xe8) {
          puVar20 = local_38 + zip->bcj2_prevByte;
        }
        else {
          puVar20 = (uint16_t *)(zip->format_name + (ulong)(uVar4 != 0xe9) * 2 + -0x20);
        }
        lVar25 = lVar25 + 1;
        uVar5 = *puVar20;
        uVar6 = zip->bcj2_code;
        uVar22 = (zip->bcj2_range >> 0xb) * (uint)uVar5;
        outSize = local_70;
        sVar23 = local_80;
        if (uVar6 < uVar22) {
          zip->bcj2_range = uVar22;
          *puVar20 = (short)(0x800 - uVar5 >> 5) + uVar5;
          if (uVar22 < 0x1000000) {
            if (local_78 == local_48) {
              iVar14 = 1;
              goto LAB_0012ec33;
            }
            zip->bcj2_range = uVar22 * 0x100;
            bVar3 = *local_78;
            local_78 = local_78 + 1;
            zip->bcj2_code = (uint)bVar3 | uVar6 << 8;
          }
          zip->bcj2_prevByte = uVar4;
          iVar14 = 0;
        }
        else {
          uVar21 = zip->bcj2_range - uVar22;
          zip->bcj2_range = uVar21;
          zip->bcj2_code = uVar6 - uVar22;
          *puVar20 = uVar5 - (uVar5 >> 5);
          if (uVar21 < 0x1000000) {
            if (local_78 == local_48) {
              iVar14 = 1;
              goto LAB_0012ec33;
            }
            zip->bcj2_range = uVar21 * 0x100;
            bVar3 = *local_78;
            local_78 = local_78 + 1;
            zip->bcj2_code = (uint)bVar3 | (uVar6 - uVar22) * 0x100;
          }
          iVar14 = 1;
          if (uVar4 == 0xe8) {
            if (3 < local_50) {
              local_50 = local_50 - 4;
              puVar15 = local_60;
              local_60 = local_60 + 1;
LAB_0012eb23:
              uVar6 = *puVar15;
              iVar14 = ((uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                        uVar6 << 0x18) - ((int)zip->bcj2_outPos + (int)uVar24)) + -4;
              local_84[0] = (uint8_t)iVar14;
              local_84[1] = (uint8_t)((uint)iVar14 >> 8);
              local_84[2] = (uint8_t)((uint)iVar14 >> 0x10);
              local_84[3] = (uint8_t)((uint)iVar14 >> 0x18);
              zip->bcj2_prevByte = local_84[3];
              bVar26 = true;
              iVar14 = 0;
              if (uVar24 < local_70) {
                uVar16 = ~uVar24 + local_70;
                if (2 < uVar16) {
                  uVar16 = 3;
                }
                memcpy(outBuf + uVar24,local_84,uVar16 + 1);
                uVar17 = 0;
                do {
                  uVar16 = uVar17 + 1;
                  bVar26 = uVar17 < 3;
                  if (!bVar26) break;
                  lVar2 = uVar17 + uVar24;
                  uVar17 = uVar16;
                } while (lVar2 + 1U < local_70);
                uVar24 = uVar24 + uVar16;
              }
              else {
                uVar16 = 0;
              }
              outSize = local_70;
              sVar23 = local_80;
              if (bVar26) {
                uVar17 = (ulong)(4 - (uint)uVar16);
                zip->odd_bcj_size = uVar17;
                iVar14 = 0xd;
                if ((uint)uVar16 < 4) {
                  memcpy(local_40,local_84 + (uVar16 & 0xffffffff),uVar17);
                  outSize = local_70;
                  sVar23 = local_80;
                  iVar14 = 0xd;
                }
              }
            }
          }
          else if (3 < local_58) {
            local_58 = local_58 - 4;
            puVar15 = local_68;
            local_68 = local_68 + 1;
            goto LAB_0012eb23;
          }
        }
      }
LAB_0012ec33:
    } while (iVar14 == 0);
    if (iVar14 != 0xd) {
      return -0x19;
    }
    zip->tmp_stream_bytes_remaining = zip->tmp_stream_bytes_remaining - lVar25;
    zip->sub_stream_bytes_remaining[0] = local_50;
    zip->sub_stream_bytes_remaining[1] = local_58;
    zip->sub_stream_bytes_remaining[2] = (long)local_48 - (long)local_78;
  }
  zip->bcj2_outPos = zip->bcj2_outPos + uVar24;
  return uVar24;
}

Assistant:

static ssize_t
Bcj2_Decode(struct _7zip *zip, uint8_t *outBuf, size_t outSize)
{
	size_t inPos = 0, outPos = 0;
	const uint8_t *buf0, *buf1, *buf2, *buf3;
	size_t size0, size1, size2, size3;
	const uint8_t *buffer, *bufferLim;
	unsigned int i, j;

	size0 = zip->tmp_stream_bytes_remaining;
	buf0 = zip->tmp_stream_buff + zip->tmp_stream_bytes_avail - size0;
	size1 = zip->sub_stream_bytes_remaining[0];
	buf1 = zip->sub_stream_buff[0] + zip->sub_stream_size[0] - size1;
	size2 = zip->sub_stream_bytes_remaining[1];
	buf2 = zip->sub_stream_buff[1] + zip->sub_stream_size[1] - size2;
	size3 = zip->sub_stream_bytes_remaining[2];
	buf3 = zip->sub_stream_buff[2] + zip->sub_stream_size[2] - size3;

	buffer = buf3;
	bufferLim = buffer + size3;

	if (zip->bcj_state == 0) {
		/*
		 * Initialize.
		 */
		zip->bcj2_prevByte = 0;
		for (i = 0;
		    i < sizeof(zip->bcj2_p) / sizeof(zip->bcj2_p[0]); i++)
			zip->bcj2_p[i] = kBitModelTotal >> 1;
		RC_INIT2;
		zip->bcj_state = 1;
	}

	/*
	 * Gather the odd bytes of a previous call.
	 */
	for (i = 0; zip->odd_bcj_size > 0 && outPos < outSize; i++) {
		outBuf[outPos++] = zip->odd_bcj[i];
		zip->odd_bcj_size--;
	}

	if (outSize == 0) {
		zip->bcj2_outPos += outPos;
		return (outPos);
	}

	for (;;) {
		uint8_t b;
		CProb *prob;
		uint32_t bound;
		uint32_t ttt;

		size_t limit = size0 - inPos;
		if (outSize - outPos < limit)
			limit = outSize - outPos;

		if (zip->bcj_state == 1) {
			while (limit != 0) {
				uint8_t bb = buf0[inPos];
				outBuf[outPos++] = bb;
				if (IsJ(zip->bcj2_prevByte, bb)) {
					zip->bcj_state = 2;
					break;
				}
				inPos++;
				zip->bcj2_prevByte = bb;
				limit--;
			}
		}

		if (limit == 0 || outPos == outSize)
			break;
		zip->bcj_state = 1;

		b = buf0[inPos++];

		if (b == 0xE8)
			prob = zip->bcj2_p + zip->bcj2_prevByte;
		else if (b == 0xE9)
			prob = zip->bcj2_p + 256;
		else
			prob = zip->bcj2_p + 257;

		IF_BIT_0(prob) {
			UPDATE_0(prob)
			zip->bcj2_prevByte = b;
		} else {
			uint32_t dest;
			const uint8_t *v;
			uint8_t out[4];

			UPDATE_1(prob)
			if (b == 0xE8) {
				v = buf1;
				if (size1 < 4)
					return SZ_ERROR_DATA;
				buf1 += 4;
				size1 -= 4;
			} else {
				v = buf2;
				if (size2 < 4)
					return SZ_ERROR_DATA;
				buf2 += 4;
				size2 -= 4;
			}
			dest = (((uint32_t)v[0] << 24) |
			    ((uint32_t)v[1] << 16) |
			    ((uint32_t)v[2] << 8) |
			    ((uint32_t)v[3])) -
			    ((uint32_t)zip->bcj2_outPos + (uint32_t)outPos + 4);
			out[0] = (uint8_t)dest;
			out[1] = (uint8_t)(dest >> 8);
			out[2] = (uint8_t)(dest >> 16);
			out[3] = zip->bcj2_prevByte = (uint8_t)(dest >> 24);

			for (i = 0; i < 4 && outPos < outSize; i++)
				outBuf[outPos++] = out[i];
			if (i < 4) {
				/*
				 * Save odd bytes which we could not add into
				 * the output buffer because of out of space.
				 */
				zip->odd_bcj_size = 4 -i;
				for (; i < 4; i++) {
					j = i - 4 + (unsigned)zip->odd_bcj_size;
					zip->odd_bcj[j] = out[i];
				}
				break;
			}
		}
	}